

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbt2DShape.cpp
# Opt level: O3

void __thiscall
cbt2DsegmentShape::getAabb
          (cbt2DsegmentShape *this,cbtTransform *t,cbtVector3 *aabbMin,cbtVector3 *aabbMax)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  fVar5 = *(float *)&this->field_0x48;
  fVar6 = (t->m_basis).m_el[0].m_floats[1];
  fVar7 = (this->P2).m_floats[1];
  uVar1 = *(uint *)&(this->super_cbtConvexInternalShape).field_0x44;
  fVar4 = (t->m_basis).m_el[1].m_floats[1];
  uVar2 = *(uint *)&this->field_0x4c;
  auVar8 = ZEXT416((uint)(t->m_basis).m_el[0].m_floats[0]);
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar6)),ZEXT416(uVar1),auVar8);
  auVar17 = ZEXT416((uint)(this->P2).m_floats[0]);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar6)),auVar17,auVar8);
  auVar14 = ZEXT416((uint)(t->m_basis).m_el[1].m_floats[0]);
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar5)),ZEXT416(uVar1),auVar14);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (t->m_basis).m_el[2].m_floats[1])),ZEXT416(uVar1)
                            ,ZEXT416((uint)(t->m_basis).m_el[2].m_floats[0]));
  fVar5 = (t->m_origin).m_floats[0];
  auVar13 = ZEXT416((uint)(t->m_basis).m_el[0].m_floats[2]);
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416(uVar2),auVar13);
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416(uVar2),ZEXT416((uint)(t->m_basis).m_el[2].m_floats[2]));
  auVar16 = ZEXT416((uint)(t->m_basis).m_el[1].m_floats[2]);
  auVar15 = vfmadd231ss_fma(auVar10,ZEXT416(uVar2),auVar16);
  fVar6 = (t->m_origin).m_floats[1];
  auVar11 = ZEXT416((uint)(this->P2).m_floats[2]);
  auVar8 = vfmadd231ss_fma(auVar8,auVar11,auVar13);
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar7)),auVar17,auVar14);
  auVar13 = vfmadd231ss_fma(auVar10,auVar11,auVar16);
  auVar10 = ZEXT416((uint)(auVar12._0_4_ + (t->m_origin).m_floats[2]));
  auVar14 = vfnmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)this->zthickness),auVar10)
  ;
  auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)this->zthickness),auVar10);
  auVar8 = ZEXT416((uint)(fVar5 + auVar8._0_4_));
  auVar9 = ZEXT416((uint)(auVar9._0_4_ + fVar5));
  auVar10 = vminss_avx(auVar8,auVar9);
  auVar8 = vmaxss_avx(auVar8,auVar9);
  auVar12 = ZEXT416((uint)(fVar6 + auVar13._0_4_));
  auVar15 = ZEXT416((uint)(auVar15._0_4_ + fVar6));
  auVar9 = vmaxss_avx(auVar12,auVar15);
  auVar12 = vminss_avx(auVar12,auVar15);
  auVar9 = vinsertps_avx(auVar9,auVar11,0x10);
  fVar4 = auVar9._0_4_;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])();
  fVar5 = fVar4;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  fVar5 = auVar12._0_4_ - fVar5;
  fVar6 = fVar5;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  fVar7 = fVar6;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  aabbMin->m_floats[0] = auVar10._0_4_ - fVar4;
  aabbMin->m_floats[1] = fVar5;
  aabbMin->m_floats[2] = auVar14._0_4_;
  aabbMin->m_floats[3] = 0.0;
  aabbMax->m_floats[0] = fVar6 + auVar8._0_4_;
  fStack_24 = auVar9._4_4_;
  fStack_20 = auVar9._8_4_;
  fStack_1c = auVar9._12_4_;
  auVar9._0_4_ = fVar7 + auVar9._0_4_;
  auVar9._4_4_ = fStack_24 + 0.0;
  auVar9._8_4_ = fStack_20 + 0.0;
  auVar9._12_4_ = fStack_1c + 0.0;
  uVar3 = vmovlps_avx(auVar9);
  *(undefined8 *)(aabbMax->m_floats + 1) = uVar3;
  aabbMax->m_floats[3] = 0.0;
  return;
}

Assistant:

void cbt2DsegmentShape::getAabb(const cbtTransform& t,cbtVector3& aabbMin,cbtVector3& aabbMax) const
{
    cbtVector3 P1w = t*P1;
    cbtVector3 P2w = t*P2;
    cbtVector3 vminabs (std::min(P1w.x(),P2w.x()), std::min(P1w.y(),P2w.y()),  P1w.z()-(zthickness*0.5f));
    cbtVector3 vmaxabs (std::max(P1w.x(),P2w.x()), std::max(P1w.y(),P2w.y()),  P1w.z()+(zthickness*0.5f));
    vminabs -= cbtVector3(getMargin(),getMargin(),0);
    vmaxabs += cbtVector3(getMargin(),getMargin(),0);
    aabbMin = vminabs;
    aabbMax = vmaxabs;
}